

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O0

void __thiscall Assimp::HMPImporter::ValidateHeader_HMP457(HMPImporter *this)

{
  DeadlyImportError *pDVar1;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_9a;
  allocator<char> local_99;
  string local_98;
  undefined1 local_72;
  allocator<char> local_71;
  string local_70;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  uchar *local_18;
  Header_HMP5 *pcHeader;
  HMPImporter *this_local;
  
  local_18 = (this->super_MDLImporter).mBuffer;
  pcHeader = (Header_HMP5 *)this;
  if ((this->super_MDLImporter).iFileSize < 0x78) {
    local_4d = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "HMP file is too small (header size is 120 bytes, this file is smaller)",&local_39);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_38);
    local_4d = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (((*(float *)(local_18 + 0x24) != 0.0) || (NAN(*(float *)(local_18 + 0x24)))) &&
     ((*(float *)(local_18 + 0x28) != 0.0 || (NAN(*(float *)(local_18 + 0x28)))))) {
    if ((1.0 < *(float *)(local_18 + 0x2c) || *(float *)(local_18 + 0x2c) == 1.0) &&
       (1.0 <= (float)*(int *)(local_18 + 0x3c) / *(float *)(local_18 + 0x2c))) {
      if (*(int *)(local_18 + 0x44) != 0) {
        return;
      }
      pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"There are no frames. At least one should be there",&local_c1);
      DeadlyImportError::DeadlyImportError(pDVar1,&local_c0);
      __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    local_9a = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Number of triangles in either x or y direction is zero",
               &local_99);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_98);
    local_9a = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  local_72 = 1;
  pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Size of triangles in either  x or y direction is zero",&local_71);
  DeadlyImportError::DeadlyImportError(pDVar1,&local_70);
  local_72 = 0;
  __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void HMPImporter::ValidateHeader_HMP457( )
{
    const HMP::Header_HMP5* const pcHeader = (const HMP::Header_HMP5*)mBuffer;

    if (120 > iFileSize)
    {
        throw DeadlyImportError("HMP file is too small (header size is "
            "120 bytes, this file is smaller)");
    }

    if (!pcHeader->ftrisize_x || !pcHeader->ftrisize_y)
        throw DeadlyImportError("Size of triangles in either  x or y direction is zero");

    if(pcHeader->fnumverts_x < 1.0f || (pcHeader->numverts/pcHeader->fnumverts_x) < 1.0f)
        throw DeadlyImportError("Number of triangles in either x or y direction is zero");

    if(!pcHeader->numframes)
        throw DeadlyImportError("There are no frames. At least one should be there");

}